

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

TestCaseGroup * __thiscall deqp::gls::fboc::details::Context::createRenderableTests(Context *this)

{
  const_iterator this_00;
  bool bVar1;
  TestNode *this_01;
  TestNode *node;
  TestNode *node_00;
  TestNode *pTVar2;
  _Base_ptr this_02;
  TestNode *node_01;
  reference pIVar3;
  undefined1 local_f8 [8];
  RenderableParams params_1;
  _Self local_e0;
  const_iterator it2_1;
  undefined1 local_d0 [8];
  RenderableParams params;
  _Self local_b8;
  const_iterator it2;
  TestCaseGroup *texAttTests;
  TestCaseGroup *rbAttTests;
  AttPoint *it;
  Formats texFmts;
  Formats rboFmts;
  TestCaseGroup *texRenderableTests;
  TestCaseGroup *rbRenderableTests;
  TestCaseGroup *renderableTests;
  Context *this_local;
  
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_01,this->m_testCtx,"renderable",
             "Tests for support of renderable image formats");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,this->m_testCtx,"renderbuffer","Tests for renderbuffer formats");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,this->m_testCtx,"texture","Tests for texture formats");
  FboUtil::FormatDB::getFormats
            ((Formats *)&texFmts._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &this->m_allFormats,ANY_FORMAT);
  FboUtil::FormatDB::getFormats((Formats *)&it,&this->m_allFormats,ANY_FORMAT);
  for (rbAttTests = (TestCaseGroup *)createRenderableTests::attPoints;
      (Range<unsigned_int> *)rbAttTests != &createAttachmentTests::s_kinds;
      rbAttTests = (TestCaseGroup *)&(rbAttTests->super_TestNode).m_name._M_string_length) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,this->m_testCtx,
               (char *)(rbAttTests->super_TestNode).m_testCtx,
               *(char **)&(rbAttTests->super_TestNode).m_name);
    this_02 = (_Base_ptr)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_02,this->m_testCtx,
               (char *)(rbAttTests->super_TestNode).m_testCtx,
               *(char **)&(rbAttTests->super_TestNode).m_name);
    it2._M_node = this_02;
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)&texFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
    while( true ) {
      params.format =
           (ImageFormat)
           std::
           set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
           ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)&texFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = std::operator!=(&local_b8,(_Self *)&params.format);
      if (!bVar1) break;
      local_d0._0_4_ = *(undefined4 *)&(rbAttTests->super_TestNode)._vptr_TestNode;
      local_d0._4_4_ = 0x8d41;
      pIVar3 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_b8);
      params._0_8_ = *pIVar3;
      node_01 = (TestNode *)operator_new(0x88);
      RenderableTest::RenderableTest((RenderableTest *)node_01,this,(Params *)local_d0);
      tcu::TestNode::addChild(pTVar2,node_01);
      it2_1._M_node =
           (_Base_ptr)
           std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator++(&local_b8,0);
    }
    tcu::TestNode::addChild(node,pTVar2);
    local_e0._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)&it);
    while( true ) {
      params_1.format =
           (ImageFormat)
           std::
           set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
           ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)&it);
      bVar1 = std::operator!=(&local_e0,(_Self *)&params_1.format);
      if (!bVar1) break;
      local_f8._0_4_ = *(undefined4 *)&(rbAttTests->super_TestNode)._vptr_TestNode;
      local_f8._4_4_ = 0x1702;
      pIVar3 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_e0);
      this_00 = it2;
      params_1._0_8_ = *pIVar3;
      pTVar2 = (TestNode *)operator_new(0x88);
      RenderableTest::RenderableTest((RenderableTest *)pTVar2,this,(Params *)local_f8);
      tcu::TestNode::addChild((TestNode *)this_00._M_node,pTVar2);
      std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator++(&local_e0,0);
    }
    tcu::TestNode::addChild(node_00,(TestNode *)it2._M_node);
  }
  tcu::TestNode::addChild(this_01,node);
  tcu::TestNode::addChild(this_01,node_00);
  std::
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
          *)&it);
  std::
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
          *)&texFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (TestCaseGroup *)this_01;
}

Assistant:

TestCaseGroup* Context::createRenderableTests (void)
{
	TestCaseGroup* const renderableTests = new TestCaseGroup(
		m_testCtx, "renderable", "Tests for support of renderable image formats");

	TestCaseGroup* const rbRenderableTests = new TestCaseGroup(
		m_testCtx, "renderbuffer", "Tests for renderbuffer formats");

	TestCaseGroup* const texRenderableTests = new TestCaseGroup(
		m_testCtx, "texture", "Tests for texture formats");

	static const struct AttPoint {
		GLenum			attPoint;
		const char*		name;
		const char*		desc;
	} attPoints[] =
	{
		{ GL_COLOR_ATTACHMENT0,		"color0",	"Tests for color attachments"	},
		{ GL_STENCIL_ATTACHMENT,	"stencil",	"Tests for stencil attachments" },
		{ GL_DEPTH_ATTACHMENT,		"depth",	"Tests for depth attachments"	},
	};

	// At each attachment point, iterate through all the possible formats to
	// detect both false positives and false negatives.
	const Formats rboFmts = m_allFormats.getFormats(ANY_FORMAT);
	const Formats texFmts = m_allFormats.getFormats(ANY_FORMAT);

	for (const AttPoint* it = DE_ARRAY_BEGIN(attPoints); it != DE_ARRAY_END(attPoints); it++)
	{
		TestCaseGroup* const rbAttTests = new TestCaseGroup(m_testCtx, it->name, it->desc);
		TestCaseGroup* const texAttTests = new TestCaseGroup(m_testCtx, it->name, it->desc);

		for (Formats::const_iterator it2 = rboFmts.begin(); it2 != rboFmts.end(); it2++)
		{
			const RenderableParams params = { it->attPoint, GL_RENDERBUFFER, *it2 };
			rbAttTests->addChild(new RenderableTest(*this, params));
		}
		rbRenderableTests->addChild(rbAttTests);

		for (Formats::const_iterator it2 = texFmts.begin(); it2 != texFmts.end(); it2++)
		{
			const RenderableParams params = { it->attPoint, GL_TEXTURE, *it2 };
			texAttTests->addChild(new RenderableTest(*this, params));
		}
		texRenderableTests->addChild(texAttTests);
	}
	renderableTests->addChild(rbRenderableTests);
	renderableTests->addChild(texRenderableTests);

	return renderableTests;
}